

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Value * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::operator[]
          (InnerMap *this,MapKey *k)

{
  pointer this_00;
  value_type **ppvVar1;
  MapKey *in_RDI;
  KeyValuePair *in_stack_00000028;
  InnerMap *in_stack_00000030;
  KeyValuePair kv;
  value_type *in_stack_ffffffffffffff90;
  KeyValuePair local_28;
  
  KeyValuePair::KeyValuePair(&local_28,in_RDI,in_stack_ffffffffffffff90);
  insert(in_stack_00000030,in_stack_00000028);
  this_00 = iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
            ::operator->((iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                          *)0x443110);
  ppvVar1 = KeyValuePair::value(this_00);
  KeyValuePair::~KeyValuePair((KeyValuePair *)0x44312f);
  return ppvVar1;
}

Assistant:

Value& operator[](const Key& k) {
      KeyValuePair kv(k, Value());
      return insert(kv).first->value();
    }